

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  Enum EVar1;
  bool bVar2;
  Address AVar3;
  Type TVar4;
  mapped_type *this_00;
  mapped_type *pmVar5;
  string name;
  Opcode local_5c;
  uint64_t local_58;
  string local_50;
  
  local_5c.enum_ = opc.enum_;
  local_58 = offset;
  AVar3 = Opcode::GetMemorySize(&local_5c);
  TVar4 = GetMemoryType(type,local_5c);
  AddrExpName_abi_cxx11_(&local_50,this,addr_exp);
  if (local_50._M_string_length != 0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
              ::operator[](&this->vars,&local_50);
    pmVar5 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[](&this_00->accesses,&local_58);
    if ((pmVar5->byte_size != 0) &&
       (((pmVar5->byte_size != AVar3 || ((pmVar5->type).enum_ != TVar4.enum_)) ||
        (pmVar5->align != align)))) {
      pmVar5->is_uniform = false;
    }
    bVar2 = Opcode::IsNaturallyAligned(&local_5c,align);
    if (!bVar2) {
      pmVar5->is_uniform = false;
    }
    pmVar5->byte_size = AVar3;
    pmVar5->type = TVar4;
    pmVar5->align = align;
    EVar1 = (this_00->same_type).enum_;
    if ((EVar1 == TVar4.enum_ || EVar1 == Any) &&
       (this_00->same_align == align || this_00->same_align == 0xffffffffffffffff)) {
      this_00->same_type = TVar4;
      this_00->same_align = align;
      (this_00->last_opc).enum_ = local_5c.enum_;
    }
    else {
      (this_00->same_type).enum_ = Void;
      (this_00->same_type).type_index_ = 0xffffffff;
      this_00->same_align = 0xffffffffffffffff;
    }
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void LoadStore(uint64_t offset,
                 Opcode opc,
                 Type type,
                 Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size && ((access.byte_size != byte_size) ||
                             (access.type != type) || (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }